

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

Object<cmCMakePresetsGraph::PackagePreset> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>
::
Bind<cmCMakePresetsGraph::PackagePreset,std::__cxx11::string,cmCMakePresetsGraph::ReadFileResult(*)(std::__cxx11::string&,Json::Value_const*)>
          (Object<cmCMakePresetsGraph::PackagePreset> *this,string_view *name,
          offset_in_PackagePreset_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          member,_func_ReadFileResult_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_Value_ptr
                 *func,bool required)

{
  Object<cmCMakePresetsGraph::PackagePreset> *pOVar1;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  pcStack_10 = std::
               _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::PackagePreset_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::PackagePreset_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
             ::_M_manager;
  local_28._M_unused._0_8_ = (undefined8)func;
  local_28._8_8_ = member;
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_28,required);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

static cmJSONHelper<std::map<std::string, T>, E, CallState...> MapFilter(
    E success, E fail, F func, Filter filter)
  {
    return [success, fail, func, filter](std::map<std::string, T>& out,
                                         const Json::Value* value,
                                         CallState&&... state) -> E {
      if (!value) {
        out.clear();
        return success;
      }
      if (!value->isObject()) {
        return fail;
      }
      out.clear();
      for (auto const& key : value->getMemberNames()) {
        if (!filter(key)) {
          continue;
        }
        T t;
        E result = func(t, &(*value)[key], std::forward(state)...);
        if (result != success) {
          return result;
        }
        out[key] = std::move(t);
      }
      return success;
    };
  }